

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::SetLayerZreferenceCentered(ChElementShellReissner4 *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  pointer pLVar1;
  pointer pLVar2;
  pointer pdVar3;
  double *pdVar4;
  ulong uVar5;
  size_t kl;
  long lVar6;
  double local_38;
  
  this->tot_thickness = 0.0;
  pLVar1 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pdVar4 = &pLVar1->m_thickness;
  local_38 = 0.0;
  for (uVar5 = 0; uVar5 < (ulong)(((long)pLVar2 - (long)pLVar1) / 0x28); uVar5 = uVar5 + 1) {
    local_38 = local_38 + *pdVar4;
    pdVar4 = pdVar4 + 5;
    this->tot_thickness = local_38;
  }
  pdVar3 = (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &this->m_layers_z;
  if ((this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (this->m_layers_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar3;
  }
  local_38 = local_38 * -0.5;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_38);
  lVar6 = 3;
  for (uVar5 = 0;
      pLVar1 = (this->m_layers).
               super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->m_layers).
                             super__Vector_base<chrono::fea::ChElementShellReissner4::Layer,_std::allocator<chrono::fea::ChElementShellReissner4::Layer>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x28);
      uVar5 = uVar5 + 1) {
    local_38 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar5] + (double)(&pLVar1->m_element)[lVar6];
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(this_00,&local_38);
    lVar6 = lVar6 + 5;
  }
  return;
}

Assistant:

void ChElementShellReissner4::SetLayerZreferenceCentered() {
    // accumulate element thickness.
    tot_thickness = 0;
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        tot_thickness += m_layers[kl].Get_thickness();
    }

    // Loop again over the layers and calculate the z levels of layers, by centering them
    m_layers_z.clear();
    m_layers_z.push_back(-0.5 * this->GetThickness());
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers_z.push_back(m_layers_z[kl] + m_layers[kl].Get_thickness());
    }
}